

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngtest.c
# Opt level: O1

void write_chunks(png_structp write_ptr,user_chunk_info *data,int location)

{
  undefined8 uVar1;
  png_byte *ppVar2;
  png_byte *ppVar3;
  long lVar4;
  png_byte vpAg [5];
  png_byte local_4c [8];
  png_byte local_44 [8];
  png_byte local_3c;
  png_byte *local_38;
  
  local_38 = &data->sTER_mode;
  lVar4 = 0;
  do {
    if (data->location[lVar4] == (location | 1U)) {
      builtin_memcpy(local_44,"sTER",5);
      if (verbose == '\x01') {
        fprintf(_stdout,"\n stereo mode = %d\n",(ulong)data->sTER_mode);
      }
      uVar1 = 1;
      ppVar2 = local_38;
      ppVar3 = local_44;
LAB_00105705:
      png_write_chunk(write_ptr,ppVar3,ppVar2,uVar1);
    }
    else if (data->location[lVar4] == (location | 2U)) {
      builtin_memcpy(local_4c,"vpAg",5);
      if (verbose == '\x01') {
        fprintf(_stdout," vpAg = %lu x %lu, units = %d\n",(ulong)data->vpAg_width,
                (ulong)data->vpAg_height,(ulong)data->vpAg_units);
      }
      png_save_uint_32(local_44,data->vpAg_width);
      png_save_uint_32(local_44 + 4,data->vpAg_height);
      local_3c = data->vpAg_units;
      uVar1 = 9;
      ppVar3 = local_4c;
      ppVar2 = local_44;
      goto LAB_00105705;
    }
    lVar4 = lVar4 + 1;
    if (lVar4 != 1) {
      return;
    }
  } while( true );
}

Assistant:

static void
write_chunks(png_structp write_ptr, user_chunk_info *data, int location)
{
   int i;

   /* Notice that this preserves the original chunk order, however chunks
    * intercepted by the callback will be written *after* chunks passed to
    * libpng.  This will actually reverse a pair of sTER chunks or a pair of
    * vpAg chunks, resulting in an error later.  This is not worth worrying
    * about - the chunks should not be duplicated!
    */
   for (i = 0; i < 2; ++i)
   {
      if (data->location[i] == (location | have_sTER))
         write_sTER_chunk(write_ptr, data);

      else if (data->location[i] == (location | have_vpAg))
         write_vpAg_chunk(write_ptr, data);
   }
}